

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8c5559::ForcedKeyTestLarge::PreEncodeFrameHook
          (ForcedKeyTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  ParamType *pPVar2;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(encoder,0xd,this->cpu_used_);
    libaom_test::Encoder::Control(encoder,0xe,this->auto_alt_ref_);
    pPVar2 = testing::
             WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>_>
             ::GetParam();
    if ((pPVar2->
        super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>
        ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl ==
        (CodecFactory *)&libaom_test::kAV1) {
      libaom_test::Encoder::Control(encoder,0x21,6);
    }
  }
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  (this->super_EncoderTest).frame_flags_ = (ulong)(iVar1 == this->forced_kf_frame_num_);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, auto_alt_ref_);
#if CONFIG_AV1_ENCODER
      // override test default for tile columns if necessary.
      if (GET_PARAM(0) == &libaom_test::kAV1) {
        encoder->Control(AV1E_SET_TILE_COLUMNS, 6);
      }
#endif
    }
    frame_flags_ =
        ((int)video->frame() == forced_kf_frame_num_) ? AOM_EFLAG_FORCE_KF : 0;
  }